

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O1

void __thiscall StringTest::Test8(StringTest *this)

{
  uint uVar1;
  int iVar2;
  string t1;
  string t2;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"Hello World, I\'d like to look for a string","");
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"or","");
  uVar1 = std::__cxx11::string::find((char *)local_60,(ulong)local_40[0],0);
  if ((ulong)uVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1e3,"Failed to find first string( \"or\" )");
  }
  iVar2 = std::__cxx11::string::find((char *)local_60,(ulong)local_40[0],(ulong)uVar1);
  if (iVar2 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1ea,"Failed to refind first string( \"or\" )");
  }
  iVar2 = std::__cxx11::string::find((char *)local_60,(ulong)local_40[0],(ulong)(iVar2 + 1));
  if (iVar2 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1f1,"Failed to find second string( \"or\" )");
  }
  uVar1 = std::__cxx11::string::find((char *)local_60,0x107bdd,0);
  if ((ulong)uVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1f6,"Failed to find first \"or\"");
  }
  iVar2 = std::__cxx11::string::find((char *)local_60,0x107bdd,(ulong)uVar1);
  if (iVar2 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1fb,"Failed to refind first \"or\"");
  }
  iVar2 = std::__cxx11::string::find((char *)local_60,0x107bdd,(ulong)(iVar2 + 1));
  if (iVar2 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x200,"Failed to find second \"or\"");
  }
  iVar2 = std::__cxx11::string::find((char)local_60,0x57);
  if (iVar2 != 6) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x205,"Failed to find \'W\'");
  }
  iVar2 = std::__cxx11::string::find((char)local_60,0x6f);
  if (iVar2 != 4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x20a,"Failed to find first \'o\'");
  }
  iVar2 = std::__cxx11::string::find((char)local_60,0x6f);
  if (iVar2 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x20f,"Failed to find second \'o\'");
  }
  iVar2 = std::__cxx11::string::find((char *)local_60,0x10779a,0);
  if (iVar2 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x214,"Failed to find first \"or\" (full)");
  }
  iVar2 = std::__cxx11::string::find((char *)local_60,0x10779a,8);
  if (iVar2 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x219,"Failed to find second \"or\" (full)");
  }
  iVar2 = std::__cxx11::string::find((char *)local_60,0x10779a,7);
  if (iVar2 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x21e,"Failed to refind first \"or\" (full)");
  }
  TestCase::TestPassed(&this->super_TestCase);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return;
}

Assistant:

void Test8()
	{
		string t1 = "Hello World, I'd like to look for a string";
		string t2 = "or";
		
		unsigned i = t1.find( t2 );
		
		if ( i != 7 )
			TestFailed( "Failed to find first string( \"or\" )" );
		
		i = t1.find( t2, i );

		LOG_NOTICE( "i = %d", i );
		
		if ( i != 7 )
			TestFailed( "Failed to refind first string( \"or\" )" );

		i = t1.find( t2, i + 1 );

		LOG_NOTICE( "i = %d", i );
		
		if ( i != 31 )
			TestFailed( "Failed to find second string( \"or\" )" );
		
		i = t1.find( "or" );

		if ( i != 7 )
			TestFailed( "Failed to find first \"or\"" );

		i = t1.find( "or", i );

		if ( i != 7 )
			TestFailed( "Failed to refind first \"or\"" );

		i = t1.find( "or", i + 1 );

		if ( i != 31 )
			TestFailed( "Failed to find second \"or\"" );

		i = t1.find( 'W' );

		if ( i != 6 )
			TestFailed( "Failed to find \'W\'" );

		i = t1.find( 'o', 4 );

		if ( i != 4 )
			TestFailed( "Failed to find first \'o\'" );
		
		i = t1.find( 'o', 5 );

		if ( i != 7 )
			TestFailed( "Failed to find second \'o\'" );
		
		i = t1.find( "orlando", 0, 2 );

		if ( i != 7 )
			TestFailed( "Failed to find first \"or\" (full)" );

		i = t1.find( "orlando", 8, 2 );

		if ( i != 31 )
			TestFailed( "Failed to find second \"or\" (full)" );

		i = t1.find( "orlando", 7, 2 );

		if ( i != 7 )
			TestFailed( "Failed to refind first \"or\" (full)" );
		
		// find
		TestPassed();
	}